

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O2

HighsTask * __thiscall
HighsSplitDeque::WorkerBunk::waitForNewTask(WorkerBunk *this,HighsSplitDeque *localDeque)

{
  pushSleeper(this,localDeque);
  HighsBinarySemaphore::acquire(&(localDeque->stealerData).semaphore);
  return (localDeque->stealerData).injectedTask;
}

Assistant:

HighsTask* waitForNewTask(HighsSplitDeque* localDeque) {
      pushSleeper(localDeque);
      localDeque->stealerData.semaphore.acquire();
      return localDeque->stealerData.injectedTask;
    }